

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O3

void __thiscall TCLAP::StdOutput::version(StdOutput *this,CmdLineInterface *_cmd)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar3;
  long *plVar4;
  string xversion;
  string progName;
  long *local_58;
  long local_50;
  long local_48 [2];
  long *local_38;
  long local_30;
  long local_28 [2];
  
  iVar2 = (*_cmd->_vptr_CmdLineInterface[10])(_cmd);
  lVar1 = *(long *)CONCAT44(extraout_var,iVar2);
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,lVar1,((long *)CONCAT44(extraout_var,iVar2))[1] + lVar1);
  iVar2 = (*_cmd->_vptr_CmdLineInterface[9])(_cmd);
  lVar1 = *(long *)CONCAT44(extraout_var_00,iVar2);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,lVar1,((long *)CONCAT44(extraout_var_00,iVar2))[1] + lVar1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  poVar3 = (ostream *)std::ostream::flush();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_38,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  version: ",0xb);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_58,local_50);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

inline void StdOutput::version(CmdLineInterface& _cmd) 
{
	std::string progName = _cmd.getProgramName();
	std::string xversion = _cmd.getVersion();

	std::cout << std::endl << progName << "  version: " 
			  << xversion << std::endl << std::endl;
}